

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::bitcast_glsl_op_abi_cxx11_
          (CompilerGLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  bool bVar1;
  CompilerError *pCVar2;
  SPIRType *in_RCX;
  bool local_1e1;
  allocator local_1b7;
  allocator local_1b6;
  allocator local_1b5;
  allocator local_1b4;
  allocator local_1b3;
  allocator local_1b2;
  allocator local_1b1;
  allocator local_1b0;
  allocator local_1af;
  allocator local_1ae;
  allocator local_1ad;
  allocator local_1ac;
  allocator local_1ab;
  allocator local_1aa;
  allocator local_1a9;
  allocator local_1a8;
  allocator local_1a7;
  allocator local_1a6;
  allocator local_1a5;
  allocator local_1a4;
  allocator local_1a3;
  allocator local_1a2;
  allocator local_1a1;
  string local_1a0 [38];
  undefined1 local_17a;
  allocator local_179;
  string local_178 [38];
  allocator local_152;
  allocator local_151;
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [38];
  allocator local_102;
  allocator local_101;
  string local_100 [38];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [38];
  allocator local_b2;
  allocator local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  allocator local_89;
  string local_88 [38];
  allocator local_62;
  allocator local_61;
  allocator local_60;
  undefined1 local_5f;
  bool local_5e;
  allocator local_5d [6];
  bool same_size_cast;
  bool integral_cast;
  allocator local_49;
  string local_48 [32];
  SPIRType *local_28;
  SPIRType *in_type_local;
  SPIRType *out_type_local;
  CompilerGLSL *this_local;
  
  in_type_local = in_type;
  out_type_local = out_type;
  this_local = this;
  if (((in_type->pointer & 1U) == 0) && ((in_RCX->pointer & 1U) == 0)) {
    if (*(int *)&(in_type->super_IVariant).field_0xc == *(int *)&(in_RCX->super_IVariant).field_0xc)
    {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",local_5d);
      ::std::allocator<char>::~allocator((allocator<char> *)local_5d);
    }
    else {
      if (*(int *)&(in_type->super_IVariant).field_0xc == 2) {
        __assert_fail("out_type.basetype != SPIRType::Boolean",
                      "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0x2133,
                      "virtual string spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                     );
      }
      if (*(int *)&(in_RCX->super_IVariant).field_0xc == 2) {
        __assert_fail("in_type.basetype != SPIRType::Boolean",
                      "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0x2134,
                      "virtual string spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                     );
      }
      local_28 = in_RCX;
      bVar1 = type_is_integral(in_type);
      local_1e1 = false;
      if (bVar1) {
        local_1e1 = type_is_integral(local_28);
      }
      local_5e = local_1e1;
      local_5f = in_type_local->width == local_28->width;
      if ((local_1e1 == false) || (!(bool)local_5f)) {
        if ((in_type_local->width == 8) &&
           (((0xf < local_28->width && (local_1e1 != false)) && (local_28->vecsize == 1)))) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"unpack8",&local_60);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_60);
        }
        else if ((((local_28->width == 8) && (in_type_local->width == 0x10)) && (local_1e1 != false)
                 ) && (in_type_local->vecsize == 1)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"pack16",&local_61);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
        }
        else if (((local_28->width == 8) && (in_type_local->width == 0x20)) &&
                ((local_1e1 != false && (in_type_local->vecsize == 1)))) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"pack32",&local_62);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_62);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 8) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 0xd)) {
          bVar1 = is_legacy_es((CompilerGLSL *)out_type);
          if (bVar1) {
            local_8a = 1;
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_88,"Float -> Uint bitcast not supported on legacy ESSL.",&local_89);
            CompilerError::CompilerError(pCVar2,(string *)local_88);
            local_8a = 0;
            __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((out_type[0x16].image.type.id & 1) == 0) &&
             (*(uint *)(out_type[0x16].member_type_index_redirection.stack_storage.aligned_char +
                       0x1c) < 0x14a)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_b0,"GL_ARB_shader_bit_encoding",&local_b1);
            require_extension_internal((CompilerGLSL *)out_type,(string *)local_b0);
            ::std::__cxx11::string::~string(local_b0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"floatBitsToUint",&local_b2);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_b2);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 7) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 0xd)) {
          bVar1 = is_legacy_es((CompilerGLSL *)out_type);
          if (bVar1) {
            local_da = 1;
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_d8,"Float -> Int bitcast not supported on legacy ESSL.",&local_d9);
            CompilerError::CompilerError(pCVar2,(string *)local_d8);
            local_da = 0;
            __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((out_type[0x16].image.type.id & 1) == 0) &&
             (*(uint *)(out_type[0x16].member_type_index_redirection.stack_storage.aligned_char +
                       0x1c) < 0x14a)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_100,"GL_ARB_shader_bit_encoding",&local_101);
            require_extension_internal((CompilerGLSL *)out_type,(string *)local_100);
            ::std::__cxx11::string::~string(local_100);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"floatBitsToInt",&local_102);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_102);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 0xd) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 8)) {
          bVar1 = is_legacy_es((CompilerGLSL *)out_type);
          if (bVar1) {
            local_12a = 1;
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_128,"Uint -> Float bitcast not supported on legacy ESSL.",&local_129);
            CompilerError::CompilerError(pCVar2,(string *)local_128);
            local_12a = 0;
            __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((out_type[0x16].image.type.id & 1) == 0) &&
             (*(uint *)(out_type[0x16].member_type_index_redirection.stack_storage.aligned_char +
                       0x1c) < 0x14a)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_150,"GL_ARB_shader_bit_encoding",&local_151);
            require_extension_internal((CompilerGLSL *)out_type,(string *)local_150);
            ::std::__cxx11::string::~string(local_150);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_151);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"uintBitsToFloat",&local_152);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_152);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 0xd) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 7)) {
          bVar1 = is_legacy_es((CompilerGLSL *)out_type);
          if (bVar1) {
            local_17a = 1;
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_178,"Int -> Float bitcast not supported on legacy ESSL.",&local_179);
            CompilerError::CompilerError(pCVar2,(string *)local_178);
            local_17a = 0;
            __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((out_type[0x16].image.type.id & 1) == 0) &&
             (*(uint *)(out_type[0x16].member_type_index_redirection.stack_storage.aligned_char +
                       0x1c) < 0x14a)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_1a0,"GL_ARB_shader_bit_encoding",&local_1a1);
            require_extension_internal((CompilerGLSL *)out_type,(string *)local_1a0);
            ::std::__cxx11::string::~string(local_1a0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"intBitsToFloat",&local_1a2);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a2);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 9) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 0xe)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"doubleBitsToInt64",&local_1a3);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a3);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 10) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 0xe)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"doubleBitsToUint64",&local_1a4);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a4);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 0xe) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 9)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"int64BitsToDouble",&local_1a5);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a5);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 0xe) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 10)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"uint64BitsToDouble",&local_1a6);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a6);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 5) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 0xc)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"float16BitsToInt16",&local_1a7);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a7);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 6) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 0xc)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"float16BitsToUint16",&local_1a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a8);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 0xc) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 5)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"int16BitsToFloat16",&local_1a9);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
        }
        else if ((*(int *)&(in_type_local->super_IVariant).field_0xc == 0xc) &&
                (*(int *)&(local_28->super_IVariant).field_0xc == 6)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"uint16BitsToFloat16",&local_1aa);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1aa);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 10) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 8)) && (local_28->vecsize == 2))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"packUint2x32",&local_1ab);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1ab);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 8) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 10)) &&
                (in_type_local->vecsize == 2)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"unpackUint2x32",&local_1ac);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1ac);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 0xc) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 8)) && (local_28->vecsize == 1))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"unpackFloat2x16",&local_1ad);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1ad);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 8) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 0xc)) && (local_28->vecsize == 2)
                ) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"packFloat2x16",&local_1ae);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1ae);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 7) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 5)) && (local_28->vecsize == 2))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"packInt2x16",&local_1af);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1af);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 5) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 7)) && (local_28->vecsize == 1))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"unpackInt2x16",&local_1b0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b0);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 8) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 6)) && (local_28->vecsize == 2))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"packUint2x16",&local_1b1);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 6) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 8)) && (local_28->vecsize == 1))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"unpackUint2x16",&local_1b2);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b2);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 9) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 5)) && (local_28->vecsize == 4))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"packInt4x16",&local_1b3);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b3);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 5) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 9)) && (local_28->vecsize == 1))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"unpackInt4x16",&local_1b4);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b4);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 10) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 6)) && (local_28->vecsize == 4))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"packUint4x16",&local_1b5);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b5);
        }
        else if (((*(int *)&(in_type_local->super_IVariant).field_0xc == 6) &&
                 (*(int *)&(local_28->super_IVariant).field_0xc == 10)) && (local_28->vecsize == 1))
        {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"unpackUint4x16",&local_1b6);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b6);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_1b7);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b7);
        }
      }
      else {
        (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type_local,0);
      }
    }
  }
  else {
    if ((in_type->vecsize == 2) || (in_RCX->vecsize == 2)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_48,"GL_EXT_buffer_reference_uvec2",&local_49);
      require_extension_internal((CompilerGLSL *)out_type,(string *)local_48);
      ::std::__cxx11::string::~string(local_48);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type_local,0);
  }
  return this;
}

Assistant:

string CompilerGLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	// OpBitcast can deal with pointers.
	if (out_type.pointer || in_type.pointer)
	{
		if (out_type.vecsize == 2 || in_type.vecsize == 2)
			require_extension_internal("GL_EXT_buffer_reference_uvec2");
		return type_to_glsl(out_type);
	}

	if (out_type.basetype == in_type.basetype)
		return "";

	assert(out_type.basetype != SPIRType::Boolean);
	assert(in_type.basetype != SPIRType::Boolean);

	bool integral_cast = type_is_integral(out_type) && type_is_integral(in_type);
	bool same_size_cast = out_type.width == in_type.width;

	// Trivial bitcast case, casts between integers.
	if (integral_cast && same_size_cast)
		return type_to_glsl(out_type);

	// Catch-all 8-bit arithmetic casts (GL_EXT_shader_explicit_arithmetic_types).
	if (out_type.width == 8 && in_type.width >= 16 && integral_cast && in_type.vecsize == 1)
		return "unpack8";
	else if (in_type.width == 8 && out_type.width == 16 && integral_cast && out_type.vecsize == 1)
		return "pack16";
	else if (in_type.width == 8 && out_type.width == 32 && integral_cast && out_type.vecsize == 1)
		return "pack32";

	// Floating <-> Integer special casts. Just have to enumerate all cases. :(
	// 16-bit, 32-bit and 64-bit floats.
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Uint bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToUint";
	}
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Int bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToInt";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Uint -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "uintBitsToFloat";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Int -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "intBitsToFloat";
	}

	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToInt64";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToUint64";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "int64BitsToDouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "uint64BitsToDouble";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Half)
		return "float16BitsToInt16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
		return "float16BitsToUint16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::Short)
		return "int16BitsToFloat16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
		return "uint16BitsToFloat16";

	// And finally, some even more special purpose casts.
	if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UInt && in_type.vecsize == 2)
		return "packUint2x32";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UInt64 && out_type.vecsize == 2)
		return "unpackUint2x32";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackFloat2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
		return "packFloat2x16";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Short && in_type.vecsize == 2)
		return "packInt2x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int && in_type.vecsize == 1)
		return "unpackInt2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UShort && in_type.vecsize == 2)
		return "packUint2x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackUint2x16";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Short && in_type.vecsize == 4)
		return "packInt4x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int64 && in_type.vecsize == 1)
		return "unpackInt4x16";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UShort && in_type.vecsize == 4)
		return "packUint4x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt64 && in_type.vecsize == 1)
		return "unpackUint4x16";

	return "";
}